

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_header *p_Var2;
  _Alloc_hider _Var3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  _Alloc_hider _Var9;
  const_iterator cVar10;
  const_iterator cVar11;
  _Rb_tree_node_base *p_Var12;
  undefined8 extraout_RAX;
  key_type *__k;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ostream *poVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string local_120;
  CodeLocation local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  _Base_ptr local_d0;
  char *local_c8;
  internal *local_c0;
  undefined1 local_b8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  string local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  Message errors;
  
  std::__cxx11::string::string((string *)local_b8,file,(allocator *)&local_58);
  paVar17 = &local_100.file.field_2;
  local_100.file._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_b8,(char *)((long)local_b8 + tests._M_t._M_impl._0_8_));
  local_100.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != paVar17) {
    operator_delete(local_100.file._M_dataplus._M_p);
  }
  local_c0 = (internal *)file;
  if (local_b8 != (undefined1  [8])&tests._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)local_b8);
  }
  *this = (TypedTestSuitePState)0x1;
  tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar15 = registered_tests + -1;
  local_c8 = registered_tests;
  do {
    pbVar1 = (byte *)(pcVar15 + 1);
    pcVar15 = pcVar15 + 1;
    iVar5 = isspace((uint)*pbVar1);
  } while (iVar5 != 0);
  do {
    pcVar7 = strchr(pcVar15,0x2c);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    if (pcVar7 == (char *)0x0) {
      sVar8 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar15,pcVar15 + sVar8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar15,pcVar7);
    }
    _Var9._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_string_length != 0) {
      pcVar7 = local_58._M_dataplus._M_p + local_58._M_string_length;
      do {
        _Var3._M_p = local_58._M_dataplus._M_p;
        iVar5 = isspace((uint)(byte)pcVar7[-1]);
        _Var9._M_p = _Var3._M_p;
        if (iVar5 == 0) break;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar7 + -1);
        uVar13 = (long)paVar17 - (long)_Var3._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_58,uVar13);
        pcVar7 = local_58._M_dataplus._M_p + uVar13;
        _Var9._M_p = local_58._M_dataplus._M_p;
      } while (paVar17 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var3._M_p);
    }
    p_Var2 = &tests._M_t._M_impl.super__Rb_tree_header;
    paVar17 = &local_58.field_2;
    local_b8 = (undefined1  [8])_Var9._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar17) {
      tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_58.field_2._8_8_;
      local_b8 = (undefined1  [8])p_Var2;
    }
    tests._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ =
         local_58.field_2._M_allocated_capacity._1_7_;
    tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
         local_58.field_2._M_local_buf[0];
    tests._M_t._M_impl._0_8_ = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar17;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    if (local_b8 != (undefined1  [8])p_Var2) {
      operator_delete((void *)local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pcVar15 = strchr(pcVar15,0x2c);
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar15 + 1);
        pcVar15 = pcVar15 + 1;
        iVar5 = isspace((uint)*pbVar1);
      } while (iVar5 != 0);
    }
  } while (pcVar15 != (char *)0x0);
  Message::Message((Message *)&local_38);
  tests._M_t._M_impl._0_8_ = tests._M_t._M_impl._0_8_ & 0xffffffff00000000;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tests;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&tests;
  if (tests._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar16 = (ostream *)(local_38._M_head_impl + 0x10);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this + 8);
    local_d0 = (_Base_ptr)(this + 0x10);
    __k = (key_type *)tests._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_d8 = paVar17;
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8,__k);
      if (cVar10._M_node == (_Base_ptr)&tests) {
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                         *)local_d8->_M_local_buf,__k);
        if (cVar11._M_node == local_d0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"No test named ",0xe);
          lVar14 = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          pcVar15 = " can be found in this test suite.\n";
          goto LAB_0022fb1e;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_b8,__k);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Test ",5);
        lVar14 = 0x1b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        pcVar15 = " is listed more than once.\n";
LAB_0022fb1e:
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar15,lVar14);
      }
      __k = __k + 1;
    } while (__k != (key_type *)0x0);
  }
  iVar5 = (int)paVar17;
  p_Var12 = *(_Rb_tree_node_base **)(this + 0x20);
  if (p_Var12 != (_Rb_tree_node_base *)(this + 0x10)) {
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8,(key_type *)(p_Var12 + 1));
      if (cVar10._M_node == (_Base_ptr)&tests) {
        poVar16 = (ostream *)(local_38._M_head_impl + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".\n",2);
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      iVar5 = (int)paVar17;
    } while (p_Var12 != (_Rb_tree_node_base *)(this + 0x10));
  }
  _Var4._M_head_impl = local_38._M_head_impl;
  StringStreamToString(&local_58,local_38._M_head_impl);
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  pcVar15 = local_c8;
  if (iVar6 != 0) {
    FormatFileLocation_abi_cxx11_(&local_120,local_c0,(char *)(ulong)(uint)line,iVar5);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
    if (local_38._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  if (_Var4._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl + 8))(_Var4._M_head_impl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return pcVar15;
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    if (registered_tests_.count(name) != 0) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}